

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

TxfmFuncSSE2 fwd_txfm_type_to_func(TXFM_TYPE txfm_type)

{
  TXFM_TYPE txfm_type_local;
  TxfmFuncSSE2 local_8;
  
  if (txfm_type == '\x03') {
    local_8 = fdct32_sse4_1;
  }
  else if (txfm_type == '\x04') {
    local_8 = fdct64_new_sse4_1;
  }
  else if (txfm_type == '\v') {
    local_8 = idtx32x32_sse4_1;
  }
  else {
    local_8 = (TxfmFuncSSE2)0x0;
  }
  return local_8;
}

Assistant:

static inline TxfmFunc fwd_txfm_type_to_func(TXFM_TYPE txfm_type) {
  switch (txfm_type) {
    case TXFM_TYPE_DCT4: return av1_fdct4;
    case TXFM_TYPE_DCT8: return av1_fdct8;
    case TXFM_TYPE_DCT16: return av1_fdct16;
    case TXFM_TYPE_DCT32: return av1_fdct32;
    case TXFM_TYPE_DCT64: return av1_fdct64;
    case TXFM_TYPE_ADST4: return av1_fadst4;
    case TXFM_TYPE_ADST8: return av1_fadst8;
    case TXFM_TYPE_ADST16: return av1_fadst16;
    case TXFM_TYPE_IDENTITY4: return av1_fidentity4_c;
    case TXFM_TYPE_IDENTITY8: return av1_fidentity8_c;
    case TXFM_TYPE_IDENTITY16: return av1_fidentity16_c;
    case TXFM_TYPE_IDENTITY32: return av1_fidentity32_c;
    default: assert(0); return NULL;
  }
}